

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ParseObjectReset(Parse *pParse)

{
  u16 uVar1;
  sqlite3 *db_00;
  ParseCleanup *p;
  ParseCleanup *pCleanup;
  sqlite3 *db;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  sqlite3DbFree(db_00,pParse->aTableLock);
  while (pParse->pCleanup != (ParseCleanup *)0x0) {
    p = pParse->pCleanup;
    pParse->pCleanup = p->pNext;
    (*p->xCleanup)(db_00,p->pPtr);
    sqlite3DbFreeNN(db_00,p);
  }
  sqlite3DbFree(db_00,pParse->aLabel);
  if (pParse->pConstExpr != (ExprList *)0x0) {
    sqlite3ExprListDelete(db_00,pParse->pConstExpr);
  }
  (db_00->lookaside).bDisable = (db_00->lookaside).bDisable - (uint)pParse->disableLookaside;
  if ((db_00->lookaside).bDisable == 0) {
    uVar1 = (db_00->lookaside).szTrue;
  }
  else {
    uVar1 = 0;
  }
  (db_00->lookaside).sz = uVar1;
  db_00->pParse = pParse->pOuterParse;
  pParse->db = (sqlite3 *)0x0;
  pParse->disableLookaside = '\0';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ParseObjectReset(Parse *pParse){
  sqlite3 *db = pParse->db;
  assert( db!=0 );
  assert( db->pParse==pParse );
  assert( pParse->nested==0 );
#ifndef SQLITE_OMIT_SHARED_CACHE
  sqlite3DbFree(db, pParse->aTableLock);
#endif
  while( pParse->pCleanup ){
    ParseCleanup *pCleanup = pParse->pCleanup;
    pParse->pCleanup = pCleanup->pNext;
    pCleanup->xCleanup(db, pCleanup->pPtr);
    sqlite3DbFreeNN(db, pCleanup);
  }
  sqlite3DbFree(db, pParse->aLabel);
  if( pParse->pConstExpr ){
    sqlite3ExprListDelete(db, pParse->pConstExpr);
  }
  assert( db->lookaside.bDisable >= pParse->disableLookaside );
  db->lookaside.bDisable -= pParse->disableLookaside;
  db->lookaside.sz = db->lookaside.bDisable ? 0 : db->lookaside.szTrue;
  assert( pParse->db->pParse==pParse );
  db->pParse = pParse->pOuterParse;
  pParse->db = 0;
  pParse->disableLookaside = 0;
}